

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

bool QFileSystemEngine::isCaseSensitive(QFileSystemEntry *entry,QFileSystemMetaData *metaData)

{
  QFileSystemMetaData *metaData_local;
  QFileSystemEntry *entry_local;
  
  return true;
}

Assistant:

bool QFileSystemEngine::isCaseSensitive(const QFileSystemEntry &entry, QFileSystemMetaData &metaData)
{
#if defined(Q_OS_DARWIN)
    if (!metaData.hasFlags(QFileSystemMetaData::CaseSensitive))
        fillMetaData(entry, metaData, QFileSystemMetaData::CaseSensitive);
    return metaData.entryFlags.testFlag(QFileSystemMetaData::CaseSensitive);
#else
    Q_UNUSED(entry);
    Q_UNUSED(metaData);
    // FIXME: This may not be accurate for all file systems (QTBUG-28246)
    return true;
#endif
}